

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O2

void __thiscall ThreadTrackerItem::~ThreadTrackerItem(ThreadTrackerItem *this)

{
  std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear
            (&(this->lenStack).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->aggrStackNameRaw).super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

ThreadTrackerItem()
        : numStacks(0),
          aggrStackNameRaw(4096),
          lenName(0)
        {}